

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

BaseType_conflict3 computeThreshold<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 0.0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar4 = ABS((*(double (*) [3])*(double (*) [3])A)[lVar2]);
      if (dVar4 <= dVar3) {
        dVar4 = dVar3;
      }
      dVar3 = dVar4;
    }
    A = (Matrix33<double> *)((long)A + 0x18);
  }
  dVar4 = 2.220446049250313e-16;
  if (2.220446049250313e-16 <= dVar3) {
    dVar4 = dVar3;
  }
  return dVar4 * 100.0 * 2.220446049250313e-16;
}

Assistant:

typename TM::BaseType
computeThreshold (const TM& A)
{
    typedef typename TM::BaseType T;
    T                             maxAbsEntry (0);

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            maxAbsEntry = std::max (maxAbsEntry, std::abs (A[i][j]));

    const T eps = std::numeric_limits<T>::epsilon ();
    maxAbsEntry = std::max (maxAbsEntry, eps);

    return maxAbsEntry * T (100) * eps;
}